

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_vector.hpp
# Opt level: O3

void __thiscall poplar::compact_vector::set(compact_vector *this,uint64_t i,uint64_t v)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar3 = i * this->width_;
  puVar1 = (this->chunks_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar2 = (uint)uVar3 & 0x3f;
  uVar4 = (ulong)uVar2;
  uVar3 = uVar3 >> 6;
  uVar5 = ~(this->mask_ << uVar4) & puVar1[uVar3];
  puVar1[uVar3] = uVar5;
  puVar1[uVar3] = (this->mask_ & v) << uVar4 | uVar5;
  if (0x40 < this->width_ + uVar4) {
    uVar4 = (ulong)(byte)-(char)uVar2;
    uVar5 = ~(this->mask_ >> (uVar4 & 0x3f)) & puVar1[uVar3 + 1];
    puVar1[uVar3 + 1] = uVar5;
    puVar1[uVar3 + 1] = (v & this->mask_) >> (uVar4 & 0x3f) | uVar5;
  }
  return;
}

Assistant:

void set(uint64_t i, uint64_t v) {
        assert(i < size_);
        assert(v <= mask_);

        auto [quo, mod] = decompose_value<64>(i * width_);

        chunks_[quo] &= ~(mask_ << mod);
        chunks_[quo] |= (v & mask_) << mod;

        if (64 < mod + width_) {
            const uint64_t diff = 64 - mod;
            chunks_[quo + 1] &= ~(mask_ >> diff);
            chunks_[quo + 1] |= (v & mask_) >> diff;
        }
    }